

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

uint __thiscall Js::ByteCodeWriter::EnterLoop(ByteCodeWriter *this,ByteCodeLabel loopEntrance)

{
  code *pcVar1;
  bool bVar2;
  uint C1;
  int iVar3;
  undefined4 *puVar4;
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  OpCode op;
  LoopHeaderData local_34;
  
  if (this->useBranchIsland == true) {
    EnsureLongBranch(this,StatementBoundary);
  }
  C1 = FunctionBody::IncrLoopCount(this->m_functionWrite);
  this_00 = this->m_loopHeaders;
  if ((this_00->
      super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
      ).count != C1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xc9a,"((uint)m_loopHeaders->Count() == loopId)",
                                "(uint)m_loopHeaders->Count() == loopId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    this_00 = this->m_loopHeaders;
  }
  local_34.startOffset = (this->m_byteCodeData).currentOffset;
  local_34.isNested = 0 < this->m_loopNest;
  local_34.endOffset = 0;
  local_34.hasYield = false;
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_00,&local_34);
  iVar3 = this->m_loopNest + 1;
  this->m_loopNest = iVar3;
  *(uint *)&this->m_functionWrite->field_0x178 =
       *(uint *)&this->m_functionWrite->field_0x178 & 0xfffeffff | (uint)(1 < iVar3) << 0x10;
  bVar2 = DynamicProfileInfo::EnableImplicitCallFlags(this->m_functionWrite);
  op = LoopBodyStart;
  if (bVar2) {
    Unsigned1(this,ProfiledLoopStart,C1);
    op = ProfiledLoopBodyStart;
  }
  MarkLabel(this,loopEntrance);
  if ((this->m_doJitLoopBodies != false) || (this->m_doInterruptProbe == true)) {
    Unsigned1(this,op,C1);
  }
  return C1;
}

Assistant:

uint ByteCodeWriter::EnterLoop(Js::ByteCodeLabel loopEntrance)
    {
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            // If we are going to emit a branch island, it should be before the loop header
            this->EnsureLongBranch(Js::OpCode::StatementBoundary);
        }
#endif

        uint loopId = m_functionWrite->IncrLoopCount();
        Assert((uint)m_loopHeaders->Count() == loopId);

        m_loopHeaders->Add(LoopHeaderData(m_byteCodeData.GetCurrentOffset(), 0, m_loopNest > 0, false));
        m_loopNest++;
        m_functionWrite->SetHasNestedLoop(m_loopNest > 1);

        Js::OpCode loopBodyOpcode = Js::OpCode::LoopBodyStart;
#if ENABLE_PROFILE_INFO
        if (Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionWrite()))
        {
            this->Unsigned1(Js::OpCode::ProfiledLoopStart, loopId);
            loopBodyOpcode = Js::OpCode::ProfiledLoopBodyStart;
        }
#endif

        this->MarkLabel(loopEntrance);
        if (this->DoJitLoopBodies() || this->DoInterruptProbes())
        {
            this->Unsigned1(loopBodyOpcode, loopId);
        }

        return loopId;
    }